

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_3::CommentCollector::CommentCollector
          (CommentCollector *this,string *prev_trailing_comments,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detached_comments,string *next_leading_comments)

{
  string *next_leading_comments_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *detached_comments_local;
  string *prev_trailing_comments_local;
  CommentCollector *this_local;
  
  this->prev_trailing_comments_ = prev_trailing_comments;
  this->detached_comments_ = detached_comments;
  this->next_leading_comments_ = next_leading_comments;
  std::__cxx11::string::string((string *)&this->comment_buffer_);
  this->has_comment_ = false;
  this->is_line_comment_ = false;
  this->can_attach_to_prev_ = true;
  if (prev_trailing_comments != (string *)0x0) {
    std::__cxx11::string::clear();
  }
  if (detached_comments !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(detached_comments);
  }
  if (next_leading_comments != (string *)0x0) {
    std::__cxx11::string::clear();
  }
  return;
}

Assistant:

CommentCollector(string* prev_trailing_comments,
                   vector<string>* detached_comments,
                   string* next_leading_comments)
      : prev_trailing_comments_(prev_trailing_comments),
        detached_comments_(detached_comments),
        next_leading_comments_(next_leading_comments),
        has_comment_(false),
        is_line_comment_(false),
        can_attach_to_prev_(true) {
    if (prev_trailing_comments != NULL) prev_trailing_comments->clear();
    if (detached_comments != NULL) detached_comments->clear();
    if (next_leading_comments != NULL) next_leading_comments->clear();
  }